

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

scalar_function_t *
duckdb::GetScalarBinaryFunction<duckdb::DecimalAddOverflowCheck>
          (scalar_function_t *__return_storage_ptr__,PhysicalType type)

{
  NotImplementedException *this;
  PhysicalType type_00;
  int iVar1;
  undefined7 in_register_00000031;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  undefined1 local_68 [32];
  string local_48;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 == 0xc) {
    local_68._0_8_ =
         ScalarFunction::BinaryFunction<double,double,double,duckdb::DecimalAddOverflowCheck>;
  }
  else {
    if (iVar1 != 0xb) {
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_78 = (code *)0x0;
      uStack_70 = 0;
      switch(type) {
      case UINT8:
        local_68._0_8_ =
             ScalarFunction::
             BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::DecimalAddOverflowCheck>
        ;
        break;
      case INT8:
        local_68._0_8_ =
             ScalarFunction::
             BinaryFunction<signed_char,signed_char,signed_char,duckdb::DecimalAddOverflowCheck>;
        break;
      case UINT16:
        local_68._0_8_ =
             ScalarFunction::
             BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::DecimalAddOverflowCheck>
        ;
        break;
      case INT16:
        local_68._0_8_ =
             ScalarFunction::BinaryFunction<short,short,short,duckdb::DecimalAddOverflowCheck>;
        break;
      case UINT32:
        local_68._0_8_ =
             ScalarFunction::
             BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::DecimalAddOverflowCheck>;
        break;
      case INT32:
        local_68._0_8_ = ScalarFunction::BinaryFunction<int,int,int,duckdb::DecimalAddOverflowCheck>
        ;
        break;
      case UINT64:
        local_68._0_8_ =
             ScalarFunction::
             BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::DecimalAddOverflowCheck>
        ;
        break;
      case INT64:
        local_68._0_8_ =
             ScalarFunction::BinaryFunction<long,long,long,duckdb::DecimalAddOverflowCheck>;
        break;
      default:
        if (type == UINT128) {
          local_68._0_8_ =
               ScalarFunction::
               BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::DecimalAddOverflowCheck>
          ;
        }
        else {
          if (type != INT128) {
            this = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_68._0_8_ = local_68 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_68,"Unimplemented type for GetScalarBinaryFunction: %s","");
            TypeIdToString_abi_cxx11_(&local_48,(duckdb *)(ulong)type,type_00);
            NotImplementedException::NotImplementedException<std::__cxx11::string>
                      (this,(string *)local_68,&local_48);
            __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          local_68._0_8_ =
               ScalarFunction::
               BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::DecimalAddOverflowCheck>
          ;
        }
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 local_88._M_pod_data,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_68);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      operator=(__return_storage_ptr__,
                (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )&local_88);
      if (local_78 == (code *)0x0) {
        return __return_storage_ptr__;
      }
      (*local_78)(&local_88,&local_88,__destroy_functor);
      return __return_storage_ptr__;
    }
    local_68._0_8_ =
         ScalarFunction::BinaryFunction<float,float,float,duckdb::DecimalAddOverflowCheck>;
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             __return_storage_ptr__,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_68);
  return __return_storage_ptr__;
}

Assistant:

static scalar_function_t GetScalarBinaryFunction(PhysicalType type) {
	scalar_function_t function;
	switch (type) {
	case PhysicalType::FLOAT:
		function = &ScalarFunction::BinaryFunction<float, float, float, OP>;
		break;
	case PhysicalType::DOUBLE:
		function = &ScalarFunction::BinaryFunction<double, double, double, OP>;
		break;
	default:
		function = GetScalarIntegerFunction<OP>(type);
		break;
	}
	return function;
}